

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

cmTarget * __thiscall
cmMakefile::AddNewUtilityTarget(cmMakefile *this,string *utilityName,bool excludeFromAll)

{
  undefined7 in_register_00000011;
  pair<cmTarget_&,_bool> pVar1;
  string local_40;
  
  pVar1 = CreateNewTarget(this,utilityName,UTILITY,Yes);
  if ((int)CONCAT71(in_register_00000011,excludeFromAll) != 0) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"EXCLUDE_FROM_ALL","");
    cmTarget::SetProperty(pVar1.first,&local_40,"TRUE");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  return pVar1.first;
}

Assistant:

cmTarget* cmMakefile::AddNewUtilityTarget(const std::string& utilityName,
                                          bool excludeFromAll)
{
  cmTarget* target = this->AddNewTarget(cmStateEnums::UTILITY, utilityName);
  if (excludeFromAll) {
    target->SetProperty("EXCLUDE_FROM_ALL", "TRUE");
  }
  return target;
}